

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.h
# Opt level: O0

void google::protobuf::compiler::cpp::
     ForEachField<google::protobuf::compiler::cpp::FileGenerator::GenerateSourceForMessage(int,google::protobuf::io::Printer*)::__0>
               (Descriptor *d,anon_class_16_2_3fe543fb *func)

{
  int iVar1;
  Descriptor *d_00;
  FieldDescriptor *pFVar2;
  undefined4 local_24;
  undefined4 local_20;
  int i_2;
  int i_1;
  int i;
  anon_class_16_2_3fe543fb *func_local;
  Descriptor *d_local;
  
  i_2 = 0;
  while( true ) {
    iVar1 = Descriptor::nested_type_count(d);
    if (iVar1 <= i_2) break;
    d_00 = Descriptor::nested_type(d,i_2);
    ForEachField<google::protobuf::compiler::cpp::FileGenerator::GenerateSourceForMessage(int,google::protobuf::io::Printer*)::__0>
              (d_00,func);
    i_2 = i_2 + 1;
  }
  local_20 = 0;
  while( true ) {
    iVar1 = Descriptor::extension_count(d);
    if (iVar1 <= local_20) break;
    pFVar2 = Descriptor::extension(d,local_20);
    FileGenerator::GenerateSourceForMessage::anon_class_16_2_3fe543fb::operator()(func,pFVar2);
    local_20 = local_20 + 1;
  }
  local_24 = 0;
  while( true ) {
    iVar1 = Descriptor::field_count(d);
    if (iVar1 <= local_24) break;
    pFVar2 = Descriptor::field(d,local_24);
    FileGenerator::GenerateSourceForMessage::anon_class_16_2_3fe543fb::operator()(func,pFVar2);
    local_24 = local_24 + 1;
  }
  return;
}

Assistant:

void ForEachField(const Descriptor* d, T&& func) {
  for (int i = 0; i < d->nested_type_count(); i++) {
    ForEachField(d->nested_type(i), std::forward<T&&>(func));
  }
  for (int i = 0; i < d->extension_count(); i++) {
    func(d->extension(i));
  }
  for (int i = 0; i < d->field_count(); i++) {
    func(d->field(i));
  }
}